

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtc.c
# Opt level: O2

void run_command(uint8_t command)

{
  rtc_t *rtc;
  rtc_state_t rVar1;
  gbabus_t *pgVar2;
  char *pcVar3;
  
  pgVar2 = bus;
  if (2 < gba_log_verbosity) {
    pcVar3 = "Read";
    if (command < 8) {
      pcVar3 = "Writ";
    }
    printf("[DEBUG] [GPIO] [RTC] %sing register: 0x%X\n",pcVar3,(ulong)(command & 7));
  }
  rtc = &pgVar2->rtc;
  (pgVar2->rtc).reg = command & 7;
  if (command < 8) {
    write_register(rtc);
    rVar1 = RTC_DATA_WRITE;
  }
  else {
    read_register(rtc);
    rVar1 = RTC_DATA_READ;
  }
  rtc->state = rVar1;
  return;
}

Assistant:

void run_command(byte command) {
    rtc_t* rtc = &bus->rtc;
    bool read = command >> 3;
    byte reg = command & 0x7;

    logdebug("[GPIO] [RTC] %sing register: 0x%X", read ? "Read" : "Writ", reg);

    rtc->reg = reg;

    if (read) {
        read_register(rtc);
        rtc->state = RTC_DATA_READ;
    } else {
        write_register(rtc);
        rtc->state = RTC_DATA_WRITE;
    }
}